

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstEvaluateVisitor.cpp
# Opt level: O0

int calculate(int left,int right,TOperationType type)

{
  TOperationType type_local;
  int right_local;
  int left_local;
  
  switch(type) {
  case PLUS:
    right_local = left + right;
    break;
  case MINUS:
    right_local = left - right;
    break;
  case MULTYPLY:
    right_local = left * right;
    break;
  case MOD:
    if (right == 0) {
      __assert_fail("right != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/ConstEvaluateVisitor.cpp"
                    ,0x13,"int calculate(int, int, IRT::enums::TOperationType)");
    }
    right_local = left % right;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/ConstEvaluateVisitor.cpp"
                  ,0x16,"int calculate(int, int, IRT::enums::TOperationType)");
  }
  return right_local;
}

Assistant:

int calculate(int left, int right, IRT::enums::TOperationType type) {
    switch (type) {
        case IRT::enums::TOperationType::PLUS:
            return left + right;
        case IRT::enums::TOperationType::MINUS:
            return left - right;
        case IRT::enums::TOperationType::MULTYPLY:
            return left * right;
        case IRT::enums::TOperationType::MOD:
            assert(right != 0);
            return left % right;
        default:
            assert(false);
    }
}